

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

QModelIndex * __thiscall
QListViewPrivate::closestIndex
          (QModelIndex *__return_storage_ptr__,QListViewPrivate *this,QRect *target,
          QList<QModelIndex> *candidates)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  quintptr qVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  QModelIndex *index;
  long in_FS_OFFSET;
  int local_64;
  QListViewItem local_4c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  if ((candidates->d).size != 0) {
    index = (candidates->d).ptr;
    local_64 = 0x7fffffff;
    do {
      if (((-1 < index->r) && (-1 < index->c)) && ((index->m).ptr != (QAbstractItemModel *)0x0)) {
        indexToListViewItem(&local_4c,this,index);
        iVar11 = local_4c.w + local_4c.x + -1;
        iVar10 = local_4c.y + local_4c.h + -1;
        iVar6 = (target->x1).m_i;
        iVar7 = (target->x2).m_i;
        iVar1 = (target->y1).m_i;
        iVar2 = (target->y2).m_i;
        iVar8 = (int)(((long)iVar7 + (long)iVar6) / 2);
        iVar5 = (int)(((long)iVar2 + (long)iVar1) / 2);
        if (iVar8 < iVar11 && local_4c.x <= iVar8) {
          iVar9 = (int)(((long)iVar10 + (long)local_4c.y) / 2);
LAB_0056cd56:
          iVar9 = iVar9 - iVar5;
          iVar6 = -iVar9;
          if (0 < iVar9) {
            iVar6 = iVar9;
          }
        }
        else {
          iVar9 = (int)(((long)iVar10 + (long)local_4c.y) / 2);
          iVar11 = (int)(((long)iVar11 + (long)local_4c.x) / 2);
          if (iVar11 < iVar7 && iVar6 <= iVar11) goto LAB_0056cd56;
          if (((iVar5 < local_4c.y) || (iVar10 <= iVar5)) && (iVar2 <= iVar9 || iVar9 < iVar1)) {
            iVar11 = iVar11 - iVar8;
            iVar9 = iVar9 - iVar5;
            iVar6 = -iVar11;
            if (0 < iVar11) {
              iVar6 = iVar11;
            }
            iVar7 = -iVar9;
            if (0 < iVar9) {
              iVar7 = iVar9;
            }
            iVar6 = iVar7 + iVar6;
          }
          else {
            iVar11 = iVar11 - iVar8;
            iVar6 = -iVar11;
            if (0 < iVar11) {
              iVar6 = iVar11;
            }
          }
        }
        if (iVar6 < local_64) {
          (__return_storage_ptr__->m).ptr = (index->m).ptr;
          iVar7 = index->c;
          qVar4 = index->i;
          uVar3 = *(undefined4 *)((long)&index->i + 4);
          __return_storage_ptr__->r = index->r;
          __return_storage_ptr__->c = iVar7;
          *(int *)&__return_storage_ptr__->i = (int)qVar4;
          *(undefined4 *)((long)&__return_storage_ptr__->i + 4) = uVar3;
          local_64 = iVar6;
        }
      }
      index = index + 1;
    } while (index != (candidates->d).ptr + (candidates->d).size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QListViewPrivate::closestIndex(const QRect &target,
                                           const QList<QModelIndex> &candidates) const
{
    int distance = 0;
    int shortest = INT_MAX;
    QModelIndex closest;
    QList<QModelIndex>::const_iterator it = candidates.begin();

    for (; it != candidates.end(); ++it) {
        if (!(*it).isValid())
            continue;

        const QRect indexRect = indexToListViewItem(*it).rect();

        //if the center x (or y) position of an item is included in the rect of the other item,
        //we define the distance between them as the difference in x (or y) of their respective center.
        // Otherwise, we use the nahattan  length between the 2 items
        if ((target.center().x() >= indexRect.x() && target.center().x() < indexRect.right())
            || (indexRect.center().x() >= target.x() && indexRect.center().x() < target.right())) {
                //one item's center is at the vertical of the other
                distance = qAbs(indexRect.center().y() - target.center().y());
        } else if ((target.center().y() >= indexRect.y() && target.center().y() < indexRect.bottom())
            || (indexRect.center().y() >= target.y() && indexRect.center().y() < target.bottom())) {
                //one item's center is at the vertical of the other
                distance = qAbs(indexRect.center().x() - target.center().x());
        } else {
            distance = (indexRect.center() - target.center()).manhattanLength();
        }
        if (distance < shortest) {
            shortest = distance;
            closest = *it;
        }
    }
    return closest;
}